

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall HighsSparseMatrix::scaleCol(HighsSparseMatrix *this,HighsInt col,double colScale)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (this->format_ == kColwise) {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar3[(long)col + 1];
    for (lVar7 = (long)piVar3[col]; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      pdVar4[lVar7] = pdVar4[lVar7] * colScale;
    }
  }
  else {
    piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar6 = (ulong)(uint)this->num_row_;
    if (this->num_row_ < 1) {
      uVar6 = uVar8;
    }
    while (uVar8 != uVar6) {
      piVar1 = piVar3 + uVar8;
      iVar2 = piVar3[uVar8 + 1];
      uVar8 = uVar8 + 1;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar7 = (long)*piVar1; lVar7 < iVar2; lVar7 = lVar7 + 1) {
        if (piVar5[lVar7] == col) {
          pdVar4[lVar7] = pdVar4[lVar7] * colScale;
        }
      }
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}